

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::PerfectAggregateHashTable::Scan
          (PerfectAggregateHashTable *this,idx_t *scan_position,DataChunk *result)

{
  ulong *puVar1;
  data_ptr_t pdVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  byte bVar5;
  value_type vVar6;
  undefined1 auVar7 [8];
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var8;
  allocate_function_ptr_t this_00;
  reallocate_function_ptr_t this_01;
  uint8_t uVar9;
  int8_t iVar10;
  uint16_t uVar11;
  int16_t iVar12;
  uint uVar13;
  uint32_t uVar14;
  int32_t iVar15;
  reference pvVar16;
  reference this_02;
  reference vector;
  int64_t iVar17;
  TemplatedValidityData<unsigned_long> *pTVar18;
  uint64_t uVar19;
  type layout;
  InternalException *this_03;
  pointer *__ptr;
  idx_t iVar20;
  PrivateAllocatorData *__n;
  ulong uVar21;
  uint uVar22;
  idx_t i;
  idx_t iVar23;
  RowOperationsState row_state;
  uint32_t group_values [2048];
  idx_t local_2090;
  undefined1 local_2088 [8];
  _Head_base<0UL,_duckdb::Vector_*,_false> _Stack_2080;
  ArenaAllocator local_2078 [114];
  
  uVar21 = *scan_position;
  if (uVar21 < this->total_groups) {
    pdVar2 = (this->addresses).data;
    iVar20 = 0;
    do {
      if ((this->group_is_set).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar21] == true) {
        *(data_ptr_t *)(pdVar2 + iVar20 * 8) = this->data + this->tuple_size * uVar21;
        uVar13 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(uVar21);
        *(uint *)((long)&local_2078[0].allocated_size + iVar20 * 4) = uVar13;
        iVar20 = iVar20 + 1;
        if (iVar20 == 0x800) {
          *scan_position = *scan_position + 1;
          iVar20 = 0x800;
          break;
        }
      }
      uVar21 = *scan_position + 1;
      *scan_position = uVar21;
    } while (uVar21 < this->total_groups);
  }
  else {
    iVar20 = 0;
  }
  if (iVar20 != 0) {
    if (this->grouping_columns != 0) {
      iVar23 = this->total_required_bits;
      local_2078[0].arena_allocator.reallocate_function =
           (reallocate_function_ptr_t)&this->required_bits;
      local_2078[0].arena_allocator.free_function = (free_function_ptr_t)&this->group_minima;
      __n = (PrivateAllocatorData *)0x0;
      local_2078[0].tail = (ArenaChunk *)this;
      local_2078[0].arena_allocator.allocate_function = (allocate_function_ptr_t)result;
      do {
        this_01 = local_2078[0].arena_allocator.reallocate_function;
        this_00 = local_2078[0].arena_allocator.allocate_function;
        pvVar16 = vector<unsigned_long,_true>::operator[]
                            ((vector<unsigned_long,_true> *)
                             local_2078[0].arena_allocator.reallocate_function,(size_type)__n);
        iVar23 = iVar23 - *pvVar16;
        this_02 = vector<duckdb::Value,_true>::operator[]
                            ((vector<duckdb::Value,_true> *)
                             local_2078[0].arena_allocator.free_function,(size_type)__n);
        pvVar16 = vector<unsigned_long,_true>::operator[]
                            ((vector<unsigned_long,_true> *)this_01,(size_type)__n);
        vVar6 = *pvVar16;
        local_2078[0].arena_allocator.private_data.
        super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
        .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl =
             (unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
              )(unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                )__n;
        vector = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)this_00,(size_type)__n);
        uVar13 = (uint)(vector->type).physical_type_;
        if (7 < uVar13 - 2) {
          this_03 = (InternalException *)__cxa_allocate_exception(0x10);
          local_2088 = (undefined1  [8])local_2078;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2088,"Invalid type for perfect aggregate HT group","");
          InternalException::InternalException(this_03,(string *)local_2088);
          __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar22 = ~(uint)(-1L << ((byte)vVar6 & 0x3f));
        bVar5 = (byte)iVar23;
        switch(uVar13) {
        case 2:
          pdVar2 = vector->data;
          FlatVector::VerifyFlatVector(vector);
          uVar9 = Value::GetValueUnsafe<unsigned_char>(this_02);
          uVar21 = 0;
          do {
            uVar13 = *(uint *)((long)&local_2078[0].allocated_size + uVar21 * 4) >> (bVar5 & 0x1f) &
                     uVar22;
            if (uVar13 == 0) {
              if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_2090 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_2088,&local_2090);
                _Var8._M_head_impl = _Stack_2080._M_head_impl;
                auVar7 = local_2088;
                local_2088 = (undefined1  [8])0x0;
                _Stack_2080._M_head_impl = (Vector *)0x0;
                p_Var3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar7;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_head_impl;
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                }
                if (_Stack_2080._M_head_impl != (Vector *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             _Stack_2080._M_head_impl);
                }
                pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar18->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar4 = (byte)uVar21 & 0x3f;
              puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar21 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
            }
            else {
              pdVar2[uVar21] = (char)uVar13 + uVar9 + 0xff;
            }
            uVar21 = uVar21 + 1;
          } while (iVar20 != uVar21);
          break;
        case 3:
          pdVar2 = vector->data;
          FlatVector::VerifyFlatVector(vector);
          iVar10 = Value::GetValueUnsafe<signed_char>(this_02);
          uVar21 = 0;
          do {
            uVar13 = *(uint *)((long)&local_2078[0].allocated_size + uVar21 * 4) >> (bVar5 & 0x1f) &
                     uVar22;
            if (uVar13 == 0) {
              if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_2090 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_2088,&local_2090);
                _Var8._M_head_impl = _Stack_2080._M_head_impl;
                auVar7 = local_2088;
                local_2088 = (undefined1  [8])0x0;
                _Stack_2080._M_head_impl = (Vector *)0x0;
                p_Var3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar7;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_head_impl;
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                }
                if (_Stack_2080._M_head_impl != (Vector *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             _Stack_2080._M_head_impl);
                }
                pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar18->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar4 = (byte)uVar21 & 0x3f;
              puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar21 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
            }
            else {
              pdVar2[uVar21] = (char)uVar13 + iVar10 + -1;
            }
            uVar21 = uVar21 + 1;
          } while (iVar20 != uVar21);
          break;
        case 4:
          pdVar2 = vector->data;
          FlatVector::VerifyFlatVector(vector);
          uVar11 = Value::GetValueUnsafe<unsigned_short>(this_02);
          uVar21 = 0;
          do {
            uVar13 = *(uint *)((long)&local_2078[0].allocated_size + uVar21 * 4) >> (bVar5 & 0x1f) &
                     uVar22;
            if (uVar13 == 0) {
              if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_2090 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_2088,&local_2090);
                _Var8._M_head_impl = _Stack_2080._M_head_impl;
                auVar7 = local_2088;
                local_2088 = (undefined1  [8])0x0;
                _Stack_2080._M_head_impl = (Vector *)0x0;
                p_Var3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar7;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_head_impl;
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                }
                if (_Stack_2080._M_head_impl != (Vector *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             _Stack_2080._M_head_impl);
                }
                pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar18->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar4 = (byte)uVar21 & 0x3f;
              puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar21 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
            }
            else {
              *(uint16_t *)(pdVar2 + uVar21 * 2) = (short)uVar13 + (uVar11 - 1);
            }
            uVar21 = uVar21 + 1;
          } while (iVar20 != uVar21);
          break;
        case 5:
          pdVar2 = vector->data;
          FlatVector::VerifyFlatVector(vector);
          iVar12 = Value::GetValueUnsafe<short>(this_02);
          uVar21 = 0;
          do {
            uVar13 = *(uint *)((long)&local_2078[0].allocated_size + uVar21 * 4) >> (bVar5 & 0x1f) &
                     uVar22;
            if (uVar13 == 0) {
              if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_2090 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_2088,&local_2090);
                _Var8._M_head_impl = _Stack_2080._M_head_impl;
                auVar7 = local_2088;
                local_2088 = (undefined1  [8])0x0;
                _Stack_2080._M_head_impl = (Vector *)0x0;
                p_Var3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar7;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_head_impl;
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                }
                if (_Stack_2080._M_head_impl != (Vector *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             _Stack_2080._M_head_impl);
                }
                pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar18->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar4 = (byte)uVar21 & 0x3f;
              puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar21 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
            }
            else {
              *(short *)(pdVar2 + uVar21 * 2) = (short)uVar13 + iVar12 + -1;
            }
            uVar21 = uVar21 + 1;
          } while (iVar20 != uVar21);
          break;
        case 6:
          pdVar2 = vector->data;
          FlatVector::VerifyFlatVector(vector);
          uVar14 = Value::GetValueUnsafe<unsigned_int>(this_02);
          uVar21 = 0;
          do {
            uVar13 = *(uint *)((long)&local_2078[0].allocated_size + uVar21 * 4) >> (bVar5 & 0x1f) &
                     uVar22;
            if (uVar13 == 0) {
              if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_2090 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_2088,&local_2090);
                _Var8._M_head_impl = _Stack_2080._M_head_impl;
                auVar7 = local_2088;
                local_2088 = (undefined1  [8])0x0;
                _Stack_2080._M_head_impl = (Vector *)0x0;
                p_Var3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar7;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_head_impl;
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                }
                if (_Stack_2080._M_head_impl != (Vector *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             _Stack_2080._M_head_impl);
                }
                pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar18->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar4 = (byte)uVar21 & 0x3f;
              puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar21 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
            }
            else {
              *(uint *)(pdVar2 + uVar21 * 4) = uVar13 + (uVar14 - 1);
            }
            uVar21 = uVar21 + 1;
          } while (iVar20 != uVar21);
          break;
        case 7:
          pdVar2 = vector->data;
          FlatVector::VerifyFlatVector(vector);
          iVar15 = Value::GetValueUnsafe<int>(this_02);
          uVar21 = 0;
          do {
            uVar13 = *(uint *)((long)&local_2078[0].allocated_size + uVar21 * 4) >> (bVar5 & 0x1f) &
                     uVar22;
            if (uVar13 == 0) {
              if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_2090 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_2088,&local_2090);
                _Var8._M_head_impl = _Stack_2080._M_head_impl;
                auVar7 = local_2088;
                local_2088 = (undefined1  [8])0x0;
                _Stack_2080._M_head_impl = (Vector *)0x0;
                p_Var3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar7;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_head_impl;
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                }
                if (_Stack_2080._M_head_impl != (Vector *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             _Stack_2080._M_head_impl);
                }
                pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar18->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar4 = (byte)uVar21 & 0x3f;
              puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar21 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
            }
            else {
              *(uint *)(pdVar2 + uVar21 * 4) = uVar13 + iVar15 + -1;
            }
            uVar21 = uVar21 + 1;
          } while (iVar20 != uVar21);
          break;
        case 8:
          pdVar2 = vector->data;
          FlatVector::VerifyFlatVector(vector);
          uVar19 = Value::GetValueUnsafe<unsigned_long>(this_02);
          uVar21 = 0;
          do {
            uVar13 = *(uint *)((long)&local_2078[0].allocated_size + uVar21 * 4) >> (bVar5 & 0x1f) &
                     uVar22;
            if (uVar13 == 0) {
              if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_2090 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_2088,&local_2090);
                _Var8._M_head_impl = _Stack_2080._M_head_impl;
                auVar7 = local_2088;
                local_2088 = (undefined1  [8])0x0;
                _Stack_2080._M_head_impl = (Vector *)0x0;
                p_Var3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar7;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_head_impl;
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                }
                if (_Stack_2080._M_head_impl != (Vector *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             _Stack_2080._M_head_impl);
                }
                pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar18->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar4 = (byte)uVar21 & 0x3f;
              puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar21 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
            }
            else {
              *(uint64_t *)(pdVar2 + uVar21 * 8) = (long)(int)uVar13 + (uVar19 - 1);
            }
            uVar21 = uVar21 + 1;
          } while (iVar20 != uVar21);
          break;
        case 9:
          pdVar2 = vector->data;
          FlatVector::VerifyFlatVector(vector);
          iVar17 = Value::GetValueUnsafe<long>(this_02);
          uVar21 = 0;
          do {
            uVar13 = *(uint *)((long)&local_2078[0].allocated_size + uVar21 * 4) >> (bVar5 & 0x1f) &
                     uVar22;
            if (uVar13 == 0) {
              if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_2090 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_2088,&local_2090);
                _Var8._M_head_impl = _Stack_2080._M_head_impl;
                auVar7 = local_2088;
                local_2088 = (undefined1  [8])0x0;
                _Stack_2080._M_head_impl = (Vector *)0x0;
                p_Var3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar7;
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_head_impl;
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                }
                if (_Stack_2080._M_head_impl != (Vector *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             _Stack_2080._M_head_impl);
                }
                pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar18->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar4 = (byte)uVar21 & 0x3f;
              puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar21 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
            }
            else {
              *(long *)(pdVar2 + uVar21 * 8) = (long)(int)uVar13 + iVar17 + -1;
            }
            uVar21 = uVar21 + 1;
          } while (iVar20 != uVar21);
        }
        __n = (PrivateAllocatorData *)
              ((long)local_2078[0].arena_allocator.private_data.
                     super_unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::PrivateAllocatorData_*,_std::default_delete<duckdb::PrivateAllocatorData>_>
                     .super__Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false>._M_head_impl + 1)
        ;
        result = (DataChunk *)local_2078[0].arena_allocator.allocate_function;
        this = (PerfectAggregateHashTable *)local_2078[0].tail;
      } while (__n < *(PrivateAllocatorData **)((long)local_2078[0].tail + 0xf0));
    }
    result->count = iVar20;
    local_2088 = (undefined1  [8])
                 unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
                 ::operator*(&this->aggregate_allocator);
    _Stack_2080._M_head_impl = (Vector *)0x0;
    layout = shared_ptr<duckdb::TupleDataLayout,_true>::operator*
                       (&(this->super_BaseAggregateHashTable).layout_ptr);
    RowOperations::FinalizeStates
              ((RowOperationsState *)local_2088,layout,&this->addresses,result,
               this->grouping_columns);
    if ((_Head_base<0UL,_duckdb::Vector_*,_false>)_Stack_2080._M_head_impl !=
        (_Head_base<0UL,_duckdb::Vector_*,_false>)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&_Stack_2080,_Stack_2080._M_head_impl);
    }
  }
  return;
}

Assistant:

void PerfectAggregateHashTable::Scan(idx_t &scan_position, DataChunk &result) {
	auto data_pointers = FlatVector::GetData<data_ptr_t>(addresses);
	uint32_t group_values[STANDARD_VECTOR_SIZE];

	// iterate over the HT until we either have exhausted the entire HT, or
	idx_t entry_count = 0;
	for (; scan_position < total_groups; scan_position++) {
		if (group_is_set[scan_position]) {
			// this group is set: add it to the set of groups to extract
			data_pointers[entry_count] = data + tuple_size * scan_position;
			group_values[entry_count] = NumericCast<uint32_t>(scan_position);
			entry_count++;
			if (entry_count == STANDARD_VECTOR_SIZE) {
				scan_position++;
				break;
			}
		}
	}
	if (entry_count == 0) {
		// no entries found
		return;
	}
	// first reconstruct the groups from the group index
	idx_t shift = total_required_bits;
	for (idx_t i = 0; i < grouping_columns; i++) {
		shift -= required_bits[i];
		ReconstructGroupVector(group_values, group_minima[i], required_bits[i], shift, entry_count, result.data[i]);
	}
	// then construct the payloads
	result.SetCardinality(entry_count);
	RowOperationsState row_state(*aggregate_allocator);
	RowOperations::FinalizeStates(row_state, *layout_ptr, addresses, result, grouping_columns);
}